

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall
llama_context::state_seq_set_data(llama_context *this,llama_seq_id seq_id,uint8_t *src,size_t size)

{
  llama_io_read_i *in_RDI;
  exception *err;
  llama_io_read_buffer io;
  llama_context *this_00;
  uint8_t *in_stack_ffffffffffffff98;
  llama_io_read_buffer *in_stack_ffffffffffffffa0;
  size_t local_8;
  
  this_00 = (llama_context *)&stack0xffffffffffffffb8;
  llama_io_read_buffer::llama_io_read_buffer
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)this_00);
  local_8 = state_seq_read_data(this_00,in_RDI,0);
  llama_io_read_buffer::~llama_io_read_buffer((llama_io_read_buffer *)0x3e016f);
  return local_8;
}

Assistant:

size_t llama_context::state_seq_set_data(llama_seq_id seq_id, const uint8_t * src, size_t size) {
    llama_io_read_buffer io(src, size);
    try {
        return state_seq_read_data(io, seq_id);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error loading state: %s\n", __func__, err.what());
        return 0;
    }
}